

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool __thiscall PSBTOutput::IsNull(PSBTOutput *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  if (uVar2 == 0) {
    uVar1 = (this->witness_script).super_CScriptBase._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    bVar3 = false;
    if ((uVar2 == 0) && ((this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
    {
      bVar3 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PSBTOutput::IsNull() const
{
    return redeem_script.empty() && witness_script.empty() && hd_keypaths.empty() && unknown.empty();
}